

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

bool __thiscall
Hospital::Existence_Of_Phone_Number
          (Hospital *this,string *Phone_Number,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  _Alloc_hider _Var1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  pointer pNVar5;
  pointer pDVar6;
  pointer pPVar7;
  ulong uVar8;
  bool bVar9;
  string local_60;
  vector<Patient,_std::allocator<Patient>_> *local_40;
  vector<Doctor,_std::allocator<Doctor>_> *local_38;
  
  pNVar5 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = All_Of_Patients;
  local_38 = All_Of_Doctors;
  if ((All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
      super__Vector_impl_data._M_finish != pNVar5) {
    lVar4 = 0;
    uVar8 = 0;
    do {
      Human::Phone_number_Getter_abi_cxx11_
                (&local_60,(Human *)((long)&(pNVar5->super_Human).Id._M_dataplus._M_p + lVar4));
      _Var1._M_p = local_60._M_dataplus._M_p;
      if (local_60._M_string_length == Phone_Number->_M_string_length) {
        if (local_60._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar2 = bcmp(local_60._M_dataplus._M_p,(Phone_Number->_M_dataplus)._M_p,
                       local_60._M_string_length);
          bVar9 = iVar2 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_60.field_2) {
        operator_delete(_Var1._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        return true;
      }
      uVar8 = uVar8 + 1;
      pNVar5 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar5 >> 3) * -0x7d05f417d05f417d;
      lVar4 = lVar4 + 0x158;
    } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
  }
  pDVar6 = (local_38->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_38->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
      super__Vector_impl_data._M_finish != pDVar6) {
    lVar4 = 0;
    uVar8 = 0;
    do {
      Human::Phone_number_Getter_abi_cxx11_
                (&local_60,(Human *)((long)&(pDVar6->super_Human).Id._M_dataplus._M_p + lVar4));
      _Var1._M_p = local_60._M_dataplus._M_p;
      if (local_60._M_string_length == Phone_Number->_M_string_length) {
        if (local_60._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar2 = bcmp(local_60._M_dataplus._M_p,(Phone_Number->_M_dataplus)._M_p,
                       local_60._M_string_length);
          bVar9 = iVar2 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_60.field_2) {
        operator_delete(_Var1._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        return true;
      }
      uVar8 = uVar8 + 1;
      pDVar6 = (local_38->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(local_38->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pDVar6 >> 3) * 0x51b3bea3677d46cf;
      lVar4 = lVar4 + 0x178;
    } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
  }
  pPVar7 = (local_40->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_40->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar7) {
    lVar4 = 0;
    uVar8 = 0;
    do {
      Human::Phone_number_Getter_abi_cxx11_
                (&local_60,(Human *)((long)&(pPVar7->super_Human).Id._M_dataplus._M_p + lVar4));
      _Var1._M_p = local_60._M_dataplus._M_p;
      if (local_60._M_string_length == Phone_Number->_M_string_length) {
        if (local_60._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar2 = bcmp(local_60._M_dataplus._M_p,(Phone_Number->_M_dataplus)._M_p,
                       local_60._M_string_length);
          bVar9 = iVar2 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_60.field_2) {
        operator_delete(_Var1._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (bVar9 != false) {
        return bVar9;
      }
      uVar8 = uVar8 + 1;
      pPVar7 = (local_40->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(local_40->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar7 >> 4) * -0x30c30c30c30c30c3;
      lVar4 = lVar4 + 0x150;
    } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
  }
  return false;
}

Assistant:

bool Hospital:: Existence_Of_Phone_Number (string Phone_Number , vector<Nurse> All_Of_Nurses , vector<Doctor> All_Of_Doctors , vector<Patient>All_Of_Patients ){

    for (int i = 0; i <All_Of_Nurses.size() ; ++i) {
        if (All_Of_Nurses[i].Phone_number_Getter() == Phone_Number) return true;
    }
    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if (All_Of_Doctors[i].Phone_number_Getter() == Phone_Number) return true;
    }
    for (int i = 0; i <All_Of_Patients.size() ; ++i) {
        if (All_Of_Patients[i].Phone_number_Getter() == Phone_Number) return true;
    }
    return false;
}